

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshCache.cpp
# Opt level: O2

s32 __thiscall irr::scene::CMeshCache::getMeshIndex(CMeshCache *this,IMesh *mesh)

{
  long lVar1;
  IMesh *pIVar2;
  int iVar3;
  undefined4 extraout_var;
  u32 i;
  ulong uVar4;
  long lVar5;
  
  lVar5 = 0x40;
  uVar4 = 0;
  while( true ) {
    lVar1 = *(long *)&(this->super_IMeshCache).field_0x8;
    if (((*(long *)&(this->super_IMeshCache).field_0x10 - lVar1) / 0x48 & 0xffffffffU) <= uVar4) {
      return -1;
    }
    pIVar2 = *(IMesh **)(lVar1 + lVar5);
    if ((pIVar2 == mesh) ||
       ((pIVar2 != (IMesh *)0x0 &&
        (iVar3 = (*pIVar2->_vptr_IMesh[0xd])(pIVar2,0,0xff,0xffffffff,0xffffffff),
        (IMesh *)CONCAT44(extraout_var,iVar3) == mesh)))) break;
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0x48;
  }
  return (s32)uVar4;
}

Assistant:

s32 CMeshCache::getMeshIndex(const IMesh *const mesh) const
{
	for (u32 i = 0; i < Meshes.size(); ++i) {
		if (Meshes[i].Mesh == mesh || (Meshes[i].Mesh && Meshes[i].Mesh->getMesh(0) == mesh))
			return (s32)i;
	}

	return -1;
}